

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

string * __thiscall Function::getName_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  Function *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->sName);
  return __return_storage_ptr__;
}

Assistant:

string Function::getName() const
{
	return sName;
}